

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2mps.cpp
# Opt level: O3

void __thiscall MPS::add_field(MPS *this,char *str)

{
  char cVar1;
  runtime_error *this_00;
  int iVar2;
  char *pcVar3;
  char _error_msg_ [256];
  char acStack_118 [264];
  
  iVar2 = this->cur_field;
  if ((long)iVar2 < 7) {
    this->p = field_start[iVar2];
    cVar1 = *str;
    if (cVar1 != '\0') {
      pcVar3 = str + 1;
      do {
        iVar2 = this->p;
        this->p = iVar2 + 1;
        this->buf[iVar2] = cVar1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
      iVar2 = this->cur_field;
    }
    this->cur_field = iVar2 + 1;
    return;
  }
  snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "cur_field < NFIELDS",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2mps.cpp"
           ,0x26);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,acStack_118);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void add_field(const char *str) {
		throw_assert(cur_field < NFIELDS);
		p = field_start[cur_field];
		for (int i = 0; str[i]; i++) {
			buf[p++] = str[i];
		}
		cur_field++;
	}